

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O1

void uv__fs_work(uv__work *w)

{
  uv_loop_s **buf;
  int iVar1;
  uv__work *ptr;
  iovec *__iovec;
  _func_void_uv__work_ptr_int *p_Var2;
  bool bVar3;
  __mode_t __mode;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uv_dirent_type_t uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint *puVar11;
  ssize_t sVar12;
  size_t sVar13;
  _func_void_uv__work_ptr *p_Var14;
  _func_void_uv__work_ptr_int *p_Var15;
  dirent64 *dent;
  char *pcVar16;
  ulong uVar17;
  _func_void_uv__work_ptr *p_Var18;
  DIR *pDVar19;
  size_t sVar20;
  size_t sVar21;
  void *pvVar22;
  code *pcVar23;
  _func_void_uv__work_ptr_int *p_Var24;
  long lVar25;
  size_t sVar26;
  _func_void_uv__work_ptr_int *p_Var27;
  double dVar28;
  pollfd pfd;
  stat pbuf;
  _func_void_uv__work_ptr_int *local_2110;
  _func_void_uv__work_ptr_int *local_20e0;
  long local_20d8;
  undefined1 *local_20d0;
  stat64 local_20c8;
  undefined1 local_2038 [16];
  void *local_2028;
  void *local_2020;
  uint local_2018;
  uv_loop_s *local_2010;
  void *local_2008;
  _func_void_uv__work_ptr *local_2000;
  uv_fs_type local_1ff8;
  undefined4 uStack_1ff4;
  uv_loop_t *local_1ff0;
  uv_fs_cb p_Stack_1fe8;
  _func_void_uv__work_ptr_int *local_1fe0;
  uv_loop_s *puStack_1fd8;
  _func_void_uv__work_ptr *local_1fd0;
  _func_void_uv__work_ptr_int *local_1fc8;
  char *local_1f28;
  int local_1f20;
  int local_1f1c;
  uv_buf_t *local_1f10;
  _func_void_uv__work_ptr_int *local_1f08;
  uv__work local_1ee8;
  size_t local_1eb8;
  
  iVar1 = *(int *)&w[-7].done;
  puVar11 = (uint *)__errno_location();
  buf = &w[-6].loop;
  do {
    *puVar11 = 0;
    switch(*(undefined4 *)&w[-7].done) {
    case 1:
      if (uv__fs_open_no_cloexec_support == '\0') {
        uVar8 = open64((char *)w[-6].done,*(uint *)((long)w[-2].wq + 4) | 0x80000,
                       (ulong)*(uint *)(w[-2].wq + 1));
        if (-1 < (int)uVar8) {
          p_Var27 = (_func_void_uv__work_ptr_int *)(ulong)uVar8;
          goto LAB_001191f7;
        }
        if (*puVar11 != 0x16) break;
        uv__fs_open_no_cloexec_support = '\x01';
      }
      if (w[-7].wq[0] != (void *)0x0) {
        uv_rwlock_rdlock(&(w[-7].loop)->cloexec_lock);
      }
      iVar6 = open64((char *)w[-6].done,*(int *)((long)w[-2].wq + 4),(ulong)*(uint *)(w[-2].wq + 1))
      ;
      if ((-1 < iVar6) && (iVar9 = uv__cloexec_ioctl(iVar6,1), iVar9 != 0)) {
        iVar9 = uv__close(iVar6);
        iVar6 = -1;
        if (iVar9 != 0) {
switchD_0011844a_default:
          abort();
        }
      }
      if (w[-7].wq[0] != (void *)0x0) {
        uv_rwlock_rdunlock(&(w[-7].loop)->cloexec_lock);
      }
LAB_00118b49:
      p_Var27 = (_func_void_uv__work_ptr_int *)(long)iVar6;
      goto LAB_001191f7;
    case 2:
      uVar8 = uv__close_nocancel(*(int *)w[-2].wq);
      if (uVar8 == 0xffffffff) {
        uVar8 = -(uint)(*puVar11 != 0x73 && *puVar11 != 4);
      }
      break;
    case 3:
      uVar8 = uv__getiovmax();
      if (uVar8 < *(uint *)((long)w[-2].wq + 0xc)) {
        *(uint *)((long)w[-2].wq + 0xc) = uVar8;
      }
      p_Var27 = w[-1].done;
      iVar6 = *(int *)((long)w[-2].wq + 0xc);
      if ((long)p_Var27 < 0) {
        if (iVar6 == 1) {
          p_Var27 = (_func_void_uv__work_ptr_int *)
                    read(*(int *)w[-2].wq,*(void **)w[-1].work,*(size_t *)(w[-1].work + 8));
        }
        else {
          p_Var27 = (_func_void_uv__work_ptr_int *)readv(*(int *)w[-2].wq,(iovec *)w[-1].work,iVar6)
          ;
        }
      }
      else {
        if (iVar6 == 1) {
          iVar6 = *(int *)w[-2].wq;
          pvVar22 = *(void **)w[-1].work;
          sVar21 = *(size_t *)(w[-1].work + 8);
        }
        else {
          if (uv__fs_read_no_preadv != '\x01') {
            p_Var27 = (_func_void_uv__work_ptr_int *)
                      uv__preadv(*(int *)w[-2].wq,(iovec *)w[-1].work,iVar6,(int64_t)p_Var27);
            if ((p_Var27 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) ||
               (p_Var27 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, *puVar11 != 0x26))
            goto LAB_001193fa;
            uv__fs_read_no_preadv = '\x01';
          }
          iVar6 = *(int *)w[-2].wq;
          pvVar22 = *(void **)w[-1].work;
          sVar21 = *(size_t *)(w[-1].work + 8);
          p_Var27 = w[-1].done;
        }
        p_Var27 = (_func_void_uv__work_ptr_int *)pread64(iVar6,pvVar22,sVar21,(__off64_t)p_Var27);
      }
LAB_001193fa:
      if ((uv__work *)w[-1].work != w + 1) {
        uv__free((uv__work *)w[-1].work);
      }
      w[-1].work = (_func_void_uv__work_ptr *)0x0;
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      goto LAB_001191f7;
    case 4:
      uVar4 = uv__getiovmax();
      uVar8 = *(uint *)((long)w[-2].wq + 0xc);
      ptr = (uv__work *)w[-1].work;
      if (uVar8 == 0) {
        p_Var27 = (_func_void_uv__work_ptr_int *)0x0;
      }
      else {
        p_Var27 = (_func_void_uv__work_ptr_int *)0x0;
        do {
          uVar5 = uVar4;
          if (uVar8 < uVar4) {
            uVar5 = uVar8;
          }
          *(uint *)((long)w[-2].wq + 0xc) = uVar5;
          do {
            p_Var15 = w[-1].done;
            iVar6 = *(int *)((long)w[-2].wq + 0xc);
            if ((long)p_Var15 < 0) {
              __iovec = (iovec *)w[-1].work;
              if (iVar6 == 1) {
                p_Var15 = (_func_void_uv__work_ptr_int *)
                          write(*(int *)w[-2].wq,__iovec->iov_base,__iovec->iov_len);
              }
              else {
                p_Var15 = (_func_void_uv__work_ptr_int *)writev(*(int *)w[-2].wq,__iovec,iVar6);
              }
            }
            else {
              if (iVar6 == 1) {
                iVar6 = *(int *)w[-2].wq;
                pvVar22 = *(void **)w[-1].work;
                sVar21 = *(size_t *)(w[-1].work + 8);
              }
              else {
                if (uv__fs_write_no_pwritev != '\x01') {
                  p_Var15 = (_func_void_uv__work_ptr_int *)
                            uv__pwritev(*(int *)w[-2].wq,(iovec *)w[-1].work,iVar6,(int64_t)p_Var15)
                  ;
                  if ((p_Var15 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) ||
                     (p_Var15 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, *puVar11 != 0x26)
                     ) goto LAB_001187f3;
                  uv__fs_write_no_pwritev = '\x01';
                }
                iVar6 = *(int *)w[-2].wq;
                pvVar22 = *(void **)w[-1].work;
                sVar21 = *(size_t *)(w[-1].work + 8);
                p_Var15 = w[-1].done;
              }
              p_Var15 = (_func_void_uv__work_ptr_int *)
                        pwrite64(iVar6,pvVar22,sVar21,(__off64_t)p_Var15);
            }
LAB_001187f3:
          } while (((long)p_Var15 < 0) && (*puVar11 == 4));
          if ((long)p_Var15 < 1) {
            if (p_Var27 == (_func_void_uv__work_ptr_int *)0x0) {
              p_Var27 = p_Var15;
            }
            break;
          }
          if (-1 < (long)w[-1].done) {
            w[-1].done = w[-1].done + (long)p_Var15;
          }
          p_Var18 = w[-1].work;
          pcVar23 = p_Var18 + 8;
          uVar5 = 0;
          p_Var24 = p_Var15;
          do {
            p_Var2 = *(_func_void_uv__work_ptr_int **)pcVar23;
            if (p_Var24 < p_Var2) {
              *(_func_void_uv__work_ptr_int **)(pcVar23 + -8) = p_Var24 + *(ulong *)(pcVar23 + -8);
              *(ulong *)pcVar23 = *(ulong *)pcVar23 - (long)p_Var24;
              break;
            }
            uVar5 = uVar5 + 1;
            pcVar23 = pcVar23 + 0x10;
            p_Var24 = p_Var24 + -(long)p_Var2;
          } while (p_Var24 != (_func_void_uv__work_ptr_int *)0x0);
          *(uint *)((long)w[-2].wq + 0xc) = uVar5;
          w[-1].work = p_Var18 + (ulong)uVar5 * 0x10;
          p_Var27 = p_Var27 + (long)p_Var15;
          uVar8 = uVar8 - uVar5;
        } while (uVar8 != 0);
      }
      if (ptr != w + 1) {
        uv__free(ptr);
      }
      w[-1].work = (_func_void_uv__work_ptr *)0x0;
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      goto LAB_001191f7;
    case 5:
      local_20e0 = w[-1].done;
      sVar12 = sendfile64(*(int *)w[-2].wq,*(int *)((long)w[-2].wq + 4),(__off64_t *)&local_20e0,
                          (size_t)w[1].done);
      if ((sVar12 == -1) && (local_2110 = w[-1].done, (long)local_20e0 <= (long)local_2110)) {
        uVar8 = *puVar11;
        if (((uVar8 < 0x17) && ((0x440020U >> (uVar8 & 0x1f) & 1) != 0)) ||
           (p_Var27 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, uVar8 == 0x58)) {
          *puVar11 = 0;
          p_Var15 = w[1].done;
          if (p_Var15 == (_func_void_uv__work_ptr_int *)0x0) {
            p_Var27 = (_func_void_uv__work_ptr_int *)0x0;
          }
          else {
            iVar6 = *(int *)w[-2].wq;
            iVar9 = *(int *)((long)w[-2].wq + 4);
            bVar3 = true;
            p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
            do {
              while( true ) {
                p_Var27 = p_Var24;
                sVar21 = (long)p_Var15 - (long)p_Var27;
                if (0x1fff < sVar21) {
                  sVar21 = 0x2000;
                }
                do {
                  if (bVar3) {
                    sVar20 = pread64(iVar9,local_2038,sVar21,(__off64_t)local_2110);
                  }
                  else {
                    sVar20 = read(iVar9,local_2038,sVar21);
                  }
                } while ((sVar20 == 0xffffffffffffffff) && (*puVar11 == 4));
                if (sVar20 == 0) goto LAB_0011949d;
                if (sVar20 == 0xffffffffffffffff) break;
                if (0 < (long)sVar20) {
                  lVar25 = 0;
                  sVar21 = sVar20;
LAB_00119335:
                  local_20d0 = local_2038 + lVar25;
                  local_20d8 = lVar25;
LAB_00119348:
                  do {
                    sVar12 = write(iVar6,local_20d0,sVar21);
                    if (sVar12 != -1) goto LAB_001193b5;
                    if (*puVar11 != 4) {
                      if (*puVar11 == 0xb) {
                        local_20c8.st_dev._4_4_ = 4;
                        local_20c8.st_dev._0_4_ = iVar6;
                        while (iVar10 = poll((pollfd *)&local_20c8,1,-1), iVar10 == -1) {
                          if (*puVar11 != 4) goto LAB_00119488;
                        }
                        if ((local_20c8.st_dev._4_4_ & 0xfffb0000) == 0) goto LAB_00119348;
LAB_00119488:
                        *puVar11 = 5;
                      }
                      p_Var27 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
                      goto LAB_0011949d;
                    }
                  } while( true );
                }
LAB_001193cc:
                local_2110 = local_2110 + sVar20;
                p_Var27 = p_Var27 + sVar20;
                p_Var24 = p_Var27;
                if (p_Var15 <= p_Var27) goto LAB_0011949d;
              }
              if ((!bVar3) || (p_Var27 != (_func_void_uv__work_ptr_int *)0x0)) break;
              bVar3 = false;
              p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
            } while ((*puVar11 == 5) ||
                    (p_Var24 = (_func_void_uv__work_ptr_int *)0x0, *puVar11 == 0x1d));
            p_Var27 = (_func_void_uv__work_ptr_int *)
                      ((ulong)p_Var27 | -(ulong)(p_Var27 == (_func_void_uv__work_ptr_int *)0x0));
          }
LAB_0011949d:
          if (p_Var27 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_0011856c;
        }
      }
      else {
        p_Var27 = local_20e0 + -(long)w[-1].done;
        local_2110 = local_20e0;
LAB_0011856c:
        w[-1].done = local_2110;
      }
      goto LAB_001191f7;
    case 6:
      p_Var27 = w[-6].done;
      uVar8 = uv__fs_statx(-1,(char *)p_Var27,0,0,(uv_stat_t *)buf);
      if (uVar8 == 0xffffffda) {
        uVar8 = stat64((char *)p_Var27,(stat64 *)local_2038);
LAB_00118b9a:
        if (uVar8 == 0) {
          w[-6].loop = (uv_loop_s *)local_2038._0_8_;
          w[-6].wq[0] = (void *)((ulong)local_2020 & 0xffffffff);
          w[-6].wq[1] = local_2028;
          w[-5].work = (_func_void_uv__work_ptr *)((ulong)local_2020 >> 0x20);
          w[-5].done = (_func_void_uv__work_ptr_int *)(ulong)local_2018;
          w[-5].loop = local_2010;
          w[-5].wq[0] = (void *)local_2038._8_8_;
          w[-5].wq[1] = local_2008;
          w[-4].work = local_2000;
          w[-4].done = (_func_void_uv__work_ptr_int *)CONCAT44(uStack_1ff4,local_1ff8);
          w[-4].wq[1] = local_1ff0;
          w[-3].work = (_func_void_uv__work_ptr *)p_Stack_1fe8;
          w[-3].done = local_1fe0;
          w[-3].loop = puStack_1fd8;
          w[-3].wq[0] = local_1fd0;
          w[-3].wq[1] = local_1fc8;
          w[-2].work = local_1fd0;
          w[-2].done = local_1fc8;
          w[-4].loop = (uv_loop_s *)0x0;
          w[-4].wq[0] = (void *)0x0;
        }
      }
      break;
    case 7:
      p_Var27 = w[-6].done;
      uVar8 = uv__fs_statx(-1,(char *)p_Var27,0,1,(uv_stat_t *)buf);
      if (uVar8 == 0xffffffda) {
        uVar8 = lstat64((char *)p_Var27,(stat64 *)local_2038);
        goto LAB_00118b9a;
      }
      break;
    case 8:
      iVar6 = *(int *)w[-2].wq;
      iVar9 = uv__fs_statx(iVar6,"",1,0,(uv_stat_t *)buf);
      if ((iVar9 == -0x26) && (iVar9 = fstat64(iVar6,(stat64 *)local_2038), iVar9 == 0)) {
        w[-6].loop = (uv_loop_s *)local_2038._0_8_;
        w[-6].wq[0] = (void *)((ulong)local_2020 & 0xffffffff);
        w[-6].wq[1] = local_2028;
        w[-5].work = (_func_void_uv__work_ptr *)((ulong)local_2020 >> 0x20);
        w[-5].done = (_func_void_uv__work_ptr_int *)(ulong)local_2018;
        w[-5].loop = local_2010;
        w[-5].wq[0] = (void *)local_2038._8_8_;
        w[-5].wq[1] = local_2008;
        w[-4].work = local_2000;
        w[-4].done = (_func_void_uv__work_ptr_int *)CONCAT44(uStack_1ff4,local_1ff8);
        w[-4].wq[1] = local_1ff0;
        w[-3].work = (_func_void_uv__work_ptr *)p_Stack_1fe8;
        w[-3].done = local_1fe0;
        w[-3].loop = puStack_1fd8;
        w[-3].wq[0] = local_1fd0;
        w[-3].wq[1] = local_1fc8;
        w[-2].work = local_1fd0;
        w[-2].done = local_1fc8;
        w[-4].loop = (uv_loop_s *)0x0;
        w[-4].wq[0] = (void *)0x0;
      }
      p_Var27 = (_func_void_uv__work_ptr_int *)(long)iVar9;
      goto LAB_001191f7;
    case 9:
      uVar8 = ftruncate64(*(int *)w[-2].wq,(__off64_t)w[-1].done);
      break;
    case 10:
      local_2038._0_8_ = (undefined8)(double)w[-1].wq[0];
      dVar28 = (double)w[-1].wq[0] * 1000000.0;
      uVar17 = (ulong)dVar28;
      local_2038._8_8_ =
           (((long)(dVar28 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17) % 1000000) *
           1000;
      local_2028 = (void *)(long)(double)w[-1].wq[1];
      dVar28 = (double)w[-1].wq[1] * 1000000.0;
      uVar17 = (ulong)dVar28;
      local_2020 = (void *)((((long)(dVar28 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17
                             ) % 1000000) * 1000);
      uVar8 = utimensat(-100,(char *)w[-6].done,(timespec *)local_2038,0);
      break;
    case 0xb:
      local_2038._0_8_ = (undefined8)(double)w[-1].wq[0];
      dVar28 = (double)w[-1].wq[0] * 1000000.0;
      uVar17 = (ulong)dVar28;
      local_2038._8_8_ =
           (((long)(dVar28 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17) % 1000000) *
           1000;
      local_2028 = (void *)(long)(double)w[-1].wq[1];
      dVar28 = (double)w[-1].wq[1] * 1000000.0;
      uVar17 = (ulong)dVar28;
      local_2020 = (void *)((((long)(dVar28 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17
                             ) % 1000000) * 1000);
      uVar8 = futimens(*(int *)w[-2].wq,(timespec *)local_2038);
      break;
    case 0xc:
      uVar8 = access((char *)w[-6].done,*(int *)((long)w[-2].wq + 4));
      break;
    case 0xd:
      uVar8 = chmod((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0xe:
      uVar8 = fchmod(*(int *)w[-2].wq,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0xf:
      uVar8 = fsync(*(int *)w[-2].wq);
      break;
    case 0x10:
      uVar8 = fdatasync(*(int *)w[-2].wq);
      break;
    case 0x11:
      uVar8 = unlink((char *)w[-6].done);
      break;
    case 0x12:
      uVar8 = rmdir((char *)w[-6].done);
      break;
    case 0x13:
      uVar8 = mkdir((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0x14:
      pcVar16 = mkdtemp((char *)w[-6].done);
      p_Var27 = (_func_void_uv__work_ptr_int *)-(ulong)(pcVar16 == (char *)0x0);
      goto LAB_001191f7;
    case 0x15:
      uVar8 = rename((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x16:
      local_2038._0_8_ = (uv_loop_s *)0x0;
      iVar6 = scandir64((char *)w[-6].done,(dirent64 ***)local_2038,uv__fs_scandir_filter,
                        uv__fs_scandir_sort);
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      if (iVar6 != -1) {
        if (iVar6 == 0) {
          free((void *)local_2038._0_8_);
          local_2038._0_8_ = (uv_loop_s *)0x0;
        }
        w[-6].work = (_func_void_uv__work_ptr *)local_2038._0_8_;
        goto LAB_00118b49;
      }
      p_Var27 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      goto LAB_001191f7;
    case 0x17:
      uVar8 = link((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x18:
      uVar8 = symlink((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x19:
      sVar13 = pathconf((char *)w[-6].done,4);
      sVar26 = 0x100;
      if (sVar13 != 0xffffffffffffffff) {
        sVar26 = sVar13;
      }
      p_Var18 = (_func_void_uv__work_ptr *)uv__malloc(sVar26);
      if (p_Var18 == (_func_void_uv__work_ptr *)0x0) {
        *puVar11 = 0xc;
        goto LAB_00118f7f;
      }
      sVar13 = readlink((char *)w[-6].done,(char *)p_Var18,sVar26);
      if ((sVar13 == 0xffffffffffffffff) ||
         ((p_Var14 = p_Var18, sVar13 == sVar26 &&
          (p_Var14 = (_func_void_uv__work_ptr *)uv__realloc(p_Var18,sVar13 + 1),
          p_Var14 == (_func_void_uv__work_ptr *)0x0)))) {
        uv__free(p_Var18);
        p_Var27 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      }
      else {
        p_Var14[sVar13] = (_func_void_uv__work_ptr)0x0;
        w[-6].work = p_Var14;
        p_Var27 = (_func_void_uv__work_ptr_int *)0x0;
      }
      goto LAB_001191f7;
    case 0x1a:
      uVar8 = chown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1b:
      uVar8 = fchown(*(int *)w[-2].wq,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1c:
      p_Var18 = (_func_void_uv__work_ptr *)realpath((char *)w[-6].done,(char *)0x0);
      if (p_Var18 != (_func_void_uv__work_ptr *)0x0) {
        w[-6].work = p_Var18;
        goto LAB_00118dee;
      }
      goto LAB_00118f7f;
    case 0x1d:
      iVar6 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-6].done,0,0,(uv_fs_cb)0x0
                        );
      uv_fs_req_cleanup((uv_fs_t *)local_2038);
      if (iVar6 < 0) {
        p_Var27 = (_func_void_uv__work_ptr_int *)(long)iVar6;
      }
      else {
        iVar9 = fstat64(iVar6,&local_20c8);
        __mode = local_20c8.st_mode;
        if (iVar9 == 0) {
          local_2110._0_4_ =
               uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,
                          (*(uint *)((long)w[-2].wq + 4) & 1) << 7 | 0x241,local_20c8.st_mode,
                          (uv_fs_cb)0x0);
          uv_fs_req_cleanup((uv_fs_t *)local_2038);
          iVar9 = (int)local_2110;
          if (-1 < (int)local_2110) {
            iVar9 = fchmod((int)local_2110,__mode);
            if (iVar9 == -1) {
              iVar9 = -*puVar11;
            }
            else if (((ulong)w[-2].wq[0] & 0x600000000) == 0) {
LAB_0011911e:
              if (local_20c8.st_size == 0) {
                iVar9 = 0;
              }
              else {
                p_Var27 = (_func_void_uv__work_ptr_int *)0x0;
                sVar26 = local_20c8.st_size;
                do {
                  local_2038._8_4_ = 6;
                  local_1ff8 = UV_FS_SENDFILE;
                  local_1f28 = (char *)0x0;
                  local_1f10 = (uv_buf_t *)0x0;
                  local_1fd0 = (_func_void_uv__work_ptr *)0x0;
                  local_1fe0 = (_func_void_uv__work_ptr_int *)0x0;
                  puStack_1fd8 = (uv_loop_s *)0x0;
                  local_1ff0 = (uv_loop_t *)0x0;
                  p_Stack_1fe8 = (uv_fs_cb)0x0;
                  local_1f20 = (int)local_2110;
                  local_1f1c = iVar6;
                  local_1f08 = p_Var27;
                  local_1eb8 = sVar26;
                  uv__fs_work(&local_1ee8);
                  iVar9 = (int)local_1fe0;
                  uv_fs_req_cleanup((uv_fs_t *)local_2038);
                  if (iVar9 < 0) break;
                  p_Var27 = p_Var27 + (long)local_1fe0;
                  sVar26 = sVar26 - (long)local_1fe0;
                } while (sVar26 != 0);
              }
            }
            else {
              iVar10 = ioctl((int)local_2110,0x40049409,iVar6);
              iVar9 = 0;
              if (iVar10 == -1) {
                uVar8 = *puVar11;
                if (((uVar8 == 0x12) || (uVar8 == 0x19)) || (uVar8 == 0x5f)) {
                  iVar9 = -0x5f;
                  if (((ulong)w[-2].wq[0] & 0x400000000) == 0) goto LAB_0011911e;
                }
                else {
                  iVar9 = -uVar8;
                }
              }
            }
          }
        }
        else {
          local_2110._0_4_ = -1;
          iVar9 = -*puVar11;
        }
        iVar10 = 0;
        if (iVar9 < 0) {
          iVar10 = iVar9;
        }
        iVar6 = uv__close_nocheckstdio(iVar6);
        if (iVar6 == 0) {
          iVar6 = iVar10;
        }
        if (iVar9 < 0) {
          iVar6 = iVar10;
        }
        if (-1 < (int)local_2110) {
          iVar9 = uv__close_nocheckstdio((int)local_2110);
          if (iVar9 == 0) {
            iVar9 = iVar6;
          }
          if (iVar6 != 0) {
            iVar9 = iVar6;
          }
          iVar6 = 0;
          if (iVar9 != 0) {
            uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,(uv_fs_cb)0x0);
            uv_fs_req_cleanup((uv_fs_t *)local_2038);
            iVar6 = iVar9;
          }
        }
        if (iVar6 == 0) {
          p_Var27 = (_func_void_uv__work_ptr_int *)0x0;
        }
        else {
          *puVar11 = -iVar6;
          p_Var27 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
        }
      }
      goto LAB_001191f7;
    case 0x1e:
      uVar8 = lchown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4))
      ;
      break;
    case 0x1f:
      p_Var18 = (_func_void_uv__work_ptr *)uv__malloc(0x38);
      if (p_Var18 != (_func_void_uv__work_ptr *)0x0) {
        pDVar19 = opendir((char *)w[-6].done);
        *(DIR **)(p_Var18 + 0x30) = pDVar19;
        if (pDVar19 != (DIR *)0x0) {
          w[-6].work = p_Var18;
          goto LAB_00118dee;
        }
      }
      uv__free(p_Var18);
      w[-6].work = (_func_void_uv__work_ptr *)0x0;
LAB_00118f7f:
      p_Var27 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      goto LAB_001191f7;
    case 0x20:
      p_Var18 = w[-6].work;
      if (*(long *)(p_Var18 + 8) == 0) {
        uVar8 = 0;
      }
      else {
        uVar17 = 0;
LAB_001189e2:
        do {
          *puVar11 = 0;
          dent = readdir64(*(DIR **)(p_Var18 + 0x30));
          uVar8 = (uint)uVar17;
          if (dent == (dirent64 *)0x0) {
            if (*puVar11 != 0) {
LAB_00118ffc:
              if (uVar8 != 0) {
                lVar25 = 0;
                do {
                  uv__free(*(void **)(*(long *)p_Var18 + lVar25));
                  *(undefined8 *)(*(long *)p_Var18 + lVar25) = 0;
                  lVar25 = lVar25 + 0x10;
                } while (uVar17 << 4 != lVar25);
              }
              uVar8 = 0xffffffff;
            }
            break;
          }
          pcVar16 = dent->d_name;
          iVar6 = strcmp(pcVar16,".");
          if ((iVar6 == 0) || (iVar6 = strcmp(pcVar16,".."), iVar6 == 0)) {
            if (*(ulong *)(p_Var18 + 8) <= uVar17) break;
            goto LAB_001189e2;
          }
          lVar25 = *(long *)p_Var18;
          pcVar16 = uv__strdup(pcVar16);
          *(char **)(lVar25 + uVar17 * 0x10) = pcVar16;
          if (pcVar16 == (char *)0x0) goto LAB_00118ffc;
          uVar7 = uv__fs_get_dirent_type((uv__dirent_t *)dent);
          *(uv_dirent_type_t *)(lVar25 + uVar17 * 0x10 + 8) = uVar7;
          uVar8 = uVar8 + 1;
          uVar17 = (ulong)uVar8;
        } while (uVar17 < *(ulong *)(p_Var18 + 8));
      }
      p_Var27 = (_func_void_uv__work_ptr_int *)(long)(int)uVar8;
      goto LAB_001191f7;
    case 0x21:
      p_Var18 = w[-6].work;
      pDVar19 = *(DIR **)(p_Var18 + 0x30);
      if (pDVar19 != (DIR *)0x0) {
        closedir(pDVar19);
        *(undefined8 *)(p_Var18 + 0x30) = 0;
      }
      uv__free(w[-6].work);
      w[-6].work = (_func_void_uv__work_ptr *)0x0;
LAB_00118dee:
      p_Var27 = (_func_void_uv__work_ptr_int *)0x0;
      goto LAB_001191f7;
    default:
      goto switchD_0011844a_default;
    }
    p_Var27 = (_func_void_uv__work_ptr_int *)(long)(int)uVar8;
LAB_001191f7:
    p_Var15 = p_Var27;
    if (p_Var27 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_001194d0;
  } while ((iVar1 - 4U < 0xfffffffe) && (*puVar11 == 4));
  p_Var15 = (_func_void_uv__work_ptr_int *)-(long)(int)*puVar11;
LAB_001194d0:
  w[-7].wq[1] = p_Var15;
  if ((p_Var27 == (_func_void_uv__work_ptr_int *)0x0) && (*(int *)&w[-7].done - 6U < 3)) {
    w[-6].work = (_func_void_uv__work_ptr *)buf;
  }
  return;
LAB_001193b5:
  lVar25 = local_20d8 + sVar12;
  sVar21 = sVar20 - lVar25;
  if (sVar21 == 0 || (long)sVar20 < lVar25) goto LAB_001193cc;
  goto LAB_00119335;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE ||
                     req->fs_type == UV_FS_READ);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, uv__fs_close(req->file));
    X(COPYFILE, uv__fs_copyfile(req));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(LCHOWN, lchown(req->path, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_read(req));
    X(SCANDIR, uv__fs_scandir(req));
    X(OPENDIR, uv__fs_opendir(req));
    X(READDIR, uv__fs_readdir(req));
    X(CLOSEDIR, uv__fs_closedir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_write_all(req));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = UV__ERR(errno);
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}